

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O1

MIR_module_t_conflict
mir_compile_C_module(c2mir_options *options,MIR_context_t ctx,char *inputbuffer,char *source_name)

{
  int iVar1;
  long lVar2;
  MIR_module_t_conflict pMVar3;
  ReadBuffer read_buffer;
  char module_name [30];
  undefined8 local_68;
  char *local_60;
  char local_58 [40];
  
  local_68 = 0;
  options->module_num = options->module_num + 1;
  pMVar3 = (MIR_module_t_conflict)0x0;
  local_60 = inputbuffer;
  snprintf(local_58,0x1e,"__mod_%lld__");
  options->message_file = _stderr;
  iVar1 = c2mir_compile(ctx,options,t_getc,&local_68,local_58,0);
  if (iVar1 != 0) {
    lVar2 = MIR_get_module_list(ctx);
    pMVar3 = *(MIR_module_t_conflict *)(lVar2 + 8);
  }
  if ((iVar1 == 0 || pMVar3 != (MIR_module_t_conflict)0x0) == (iVar1 == 0) ||
      pMVar3 == (MIR_module_t_conflict)0x0) {
    pMVar3 = (MIR_module_t_conflict)0x0;
  }
  else {
    MIR_load_module(ctx,pMVar3);
    MIR_link(ctx,MIR_set_gen_interface,import_resolver);
  }
  return pMVar3;
}

Assistant:

MIR_module_t mir_compile_C_module(struct c2mir_options *options, MIR_context_t ctx,
                                  const char *inputbuffer, /* Code to be compiled */
                                  const char *source_name  /* Name of the function, must be unique */
) {
  int ret_code = 0;
  char module_name[30];
  struct ReadBuffer read_buffer = {.Current_char = 0, .Source_code = inputbuffer};
  MIR_module_t module = NULL;
  options->module_num++;
  snprintf(module_name, sizeof module_name, "__mod_%lld__", options->module_num);
  options->message_file = stderr;
  if (!c2mir_compile(ctx, options, t_getc, &read_buffer, module_name, NULL)) {
    ret_code = 1;
  }
  else {
    /* The module just compiled will be at the end of the list */
    module = DLIST_TAIL(MIR_module_t, *MIR_get_module_list(ctx));
  }
  if (ret_code == 0 && !module) {
    ret_code = 1;
  }
  if (ret_code == 0 && module) {
    MIR_load_module(ctx, module);
    MIR_link(ctx, MIR_set_gen_interface, import_resolver);
  }
  return ret_code == 0 && module ? module : NULL;
}